

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::SPxBasisBase<double>::multWithBase
          (SPxBasisBase<double> *this,SSVectorBase<double> *x,SSVectorBase<double> *result)

{
  int iVar1;
  VectorBase<double> *in_RDI;
  SVectorBase<double> *unaff_retaddr;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  int n;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  VectorBase<double> *w;
  
  w = in_RDI;
  if (((ulong)in_RDI[2].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    (*(code *)(in_RDI->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[5])
              (in_RDI,&in_RDI[8].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  }
  SSVectorBase<double>::clear
            ((SSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar2 = 0;
  while( true ) {
    n = iVar2;
    iVar1 = SSVectorBase<double>::dim((SSVectorBase<double> *)0x2478ac);
    if (iVar1 <= iVar2) break;
    iVar1 = n;
    DataArray<const_soplex::SVectorBase<double>_*>::operator[]
              ((DataArray<const_soplex::SVectorBase<double>_*> *)
               &in_RDI[1].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,n);
    SVectorBase<double>::operator*(unaff_retaddr,w);
    SSVectorBase<double>::add
              ((SSVectorBase<double> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20),(double)CONCAT44(iVar2,n));
    iVar2 = iVar1 + 1;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::multWithBase(SSVectorBase<R>& x, SSVectorBase<R>& result) const
{
   assert(status() > SINGULAR);
   assert(theLP->dim() == x.dim());
   assert(x.dim() == result.dim());

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   result.clear();

   assert(matrixIsSetup);

   for(int i = 0; i < x.dim(); ++i)
      result.add(i, (*matrix[i]) * x);

   return;
}